

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> __thiscall
dg::vr::ValueRelations::get(ValueRelations *this,size_t id)

{
  Handle __y;
  undefined8 extraout_RDX;
  ValueRelations *in_RSI;
  Bucket *in_RDI;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar1;
  HandlePtr mH;
  size_t in_stack_ffffffffffffffb8;
  ValueRelations *in_stack_ffffffffffffffc0;
  uint7 in_stack_ffffffffffffffd0;
  undefined8 local_10;
  undefined1 local_8;
  
  __y = getBorderH(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (__y == (HandlePtr)0x0) {
    __y = newBorderBucket(in_RSI,0);
  }
  std::pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool>::
  pair<const_dg::vr::Bucket_&,_bool,_true>
            ((pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> *)
             (ulong)in_stack_ffffffffffffffd0,in_RDI,(bool *)__y);
  pVar1._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar1.second = (bool)local_8;
  pVar1.first._M_data = local_10;
  return pVar1;
}

Assistant:

std::pair<ValueRelations::BRef, bool> ValueRelations::get(size_t id) {
    HandlePtr mH = getBorderH(id);
    return {mH ? *mH : newBorderBucket(id), false};
}